

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamReader.h
# Opt level: O0

uint __thiscall
Assimp::StreamReader<false,_false>::SetReadLimit(StreamReader<false,_false> *this,uint _limit)

{
  DeadlyImportError *this_00;
  allocator<char> local_41;
  string local_40;
  uint local_20;
  uint local_1c;
  uint prev;
  uint _limit_local;
  StreamReader<false,_false> *this_local;
  
  local_1c = _limit;
  _prev = this;
  local_20 = GetReadLimit(this);
  if (local_1c == 0xffffffff) {
    this->limit = this->end;
  }
  else {
    this->limit = this->buffer + local_1c;
    if (this->end < this->limit) {
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"StreamReader: Invalid read limit",&local_41);
      DeadlyImportError::DeadlyImportError(this_00,&local_40);
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
  }
  return local_20;
}

Assistant:

unsigned int SetReadLimit(unsigned int _limit)  {
        unsigned int prev = GetReadLimit();
        if (UINT_MAX == _limit) {
            limit = end;
            return prev;
        }

        limit = buffer + _limit;
        if (limit > end) {
            throw DeadlyImportError("StreamReader: Invalid read limit");
        }
        return prev;
    }